

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::convertTextData<unsigned_long>
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_long *source,
          char *pointerToStore,int sizeWithoutHeader)

{
  byte bVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  ulong *puVar4;
  
  bVar1 = 0x2bU >> ((byte)this->TargetFormat & 0x1f) &
          this->TargetFormat < (ETF_UTF32_BE|ETF_UTF16_BE);
  if ((this->SourceFormat < (ETF_UTF32_BE|ETF_UTF16_BE)) &&
     ((0x2bU >> (this->SourceFormat & 0x1f) & 1) != 0)) {
    if (bVar1 != 0) goto LAB_0069ec80;
  }
  else if (bVar1 == 0) goto LAB_0069ec80;
  uVar3 = *source;
  if (uVar3 != 0) {
    puVar4 = source + 1;
    do {
      puVar4[-1] = uVar3 << 8 | uVar3 >> 8;
      uVar3 = *puVar4;
      puVar4 = puVar4 + 1;
    } while (uVar3 != 0);
  }
LAB_0069ec80:
  uVar3 = 0xffffffffffffffff;
  if (-1 < sizeWithoutHeader) {
    uVar3 = (ulong)(uint)sizeWithoutHeader * 2;
  }
  puVar2 = (unsigned_short *)operator_new__(uVar3);
  this->TextData = puVar2;
  if (0 < sizeWithoutHeader) {
    uVar3 = 0;
    do {
      this->TextData[uVar3] = (unsigned_short)source[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)sizeWithoutHeader != uVar3);
    puVar2 = this->TextData;
  }
  this->TextBegin = puVar2;
  this->TextSize = sizeWithoutHeader;
  if (pointerToStore == (char *)0x0) {
    return;
  }
  operator_delete__(pointerToStore);
  return;
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}